

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::MatchExpr<const_char_*,_Catch::Matchers::StdString::ContainsMatcher>::MatchExpr
          (MatchExpr<const_char_*,_Catch::Matchers::StdString::ContainsMatcher> *this,char **arg,
          ContainsMatcher *matcher,StringRef *matcherString)

{
  size_type sVar1;
  int iVar2;
  allocator local_41;
  string local_40 [32];
  
  std::__cxx11::string::string(local_40,*arg,&local_41);
  iVar2 = (*(matcher->super_StringMatcherBase).
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher,local_40);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR___cxa_pure_virtual_00215de8;
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar2,0);
  std::__cxx11::string::~string(local_40);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00210df8;
  this->m_arg = arg;
  Matchers::StdString::ContainsMatcher::ContainsMatcher(&this->m_matcher,matcher);
  sVar1 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar1;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}